

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadBasicNodeInfo_Binary
          (COBImporter *this,Node *msh,StreamReaderLE *reader,ChunkInfo *param_3)

{
  string *out;
  uint y;
  int iVar1;
  StreamReaderLE *this_00;
  uint x;
  long lVar2;
  float fVar3;
  char local_1d9;
  float *local_1d8;
  float *local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = reader;
  StreamReader<false,_false>::Get<short>(reader);
  out = &msh->name;
  ReadString_Binary((COBImporter *)this_00,out,reader);
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>(local_1a8,out);
  local_1d9 = '_';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d9,1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  StreamReader<false,_false>::IncPtr(reader,0x30);
  (msh->transform).a1 = 1.0;
  (msh->transform).a2 = 0.0;
  (msh->transform).a3 = 0.0;
  (msh->transform).a4 = 0.0;
  (msh->transform).b1 = 0.0;
  (msh->transform).b2 = 1.0;
  (msh->transform).b3 = 0.0;
  (msh->transform).b4 = 0.0;
  (msh->transform).c1 = 0.0;
  (msh->transform).c2 = 0.0;
  (msh->transform).c3 = 1.0;
  (msh->transform).c4 = 0.0;
  (msh->transform).d1 = 0.0;
  (msh->transform).d2 = 0.0;
  (msh->transform).d3 = 0.0;
  (msh->transform).d4 = 1.0;
  local_1d0 = &(msh->transform).d1;
  local_1d8 = &(msh->transform).c1;
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      fVar3 = StreamReader<false,_false>::Get<float>(reader);
      (&(msh->transform).a1)[lVar2] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 3);
  return;
}

Assistant:

void COBImporter::ReadBasicNodeInfo_Binary(Node& msh, StreamReaderLE& reader, const ChunkInfo& /*nfo*/)
{
    const unsigned int dupes = reader.GetI2();
    ReadString_Binary(msh.name,reader);

    msh.name = format(msh.name)<<'_'<<dupes;

    // skip local axes for the moment
    reader.IncPtr(48);

    msh.transform = aiMatrix4x4();
    for(unsigned int y = 0; y < 3; ++y) {
        for(unsigned int x =0; x < 4; ++x) {
            msh.transform[y][x] = reader.GetF4();
        }
    }
}